

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall InterpTest_Local_Trace_Test::TestBody(InterpTest_Local_Trace_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  Result result;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_f0;
  pointer local_e8;
  Ptr func;
  AssertHelper local_c0;
  MemoryStream stream;
  undefined1 local_77 [15];
  Ptr trap;
  Values results;
  
  memcpy(&stream,&DAT_0027d3a9,0x41);
  func.obj_ = (DefinedFunc *)0x0;
  func.store_ = (Store *)0x0;
  func.root_index_ = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_initialize<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&func,&stream,local_77);
  InterpTest::ReadModule
            (&this->super_InterpTest,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&func)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&func);
  stream.super_Stream._vptr_Stream = (_func_int **)0x0;
  stream.super_Stream.offset_ = 0;
  stream.super_Stream.result_.enum_ = Ok;
  stream.super_Stream._20_4_ = 0;
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&stream);
  std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&stream);
  InterpTest::GetFuncExport(&func,&this->super_InterpTest,0);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  trap.root_index_ = 0;
  wabt::MemoryStream::MemoryStream(&stream,(Stream *)0x0);
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>,_true,_true>)
       (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0;
  sStack_f0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8 = (pointer)0x0;
  result = wabt::interp::Func::Call
                     (&(func.obj_)->super_Func,&(this->super_InterpTest).store_,(Values *)&buf,
                      &results,&trap,&stream.super_Stream);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&buf);
  local_108.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&buf,"Result::Ok","result",(Enum *)&local_108,&result);
  if ((char)buf._M_t.
            super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t
            .super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
            super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl == '\0') {
    testing::Message::Message((Message *)&local_108);
    if (sStack_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = (char *)((anon_union_16_6_113bff37_for_Value_0 *)&(sStack_f0.ptr_)->_M_dataplus)->
                        i64_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0xfb,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&sStack_f0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&sStack_f0);
    wabt::MemoryStream::ReleaseOutputBuffer(&stream);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,
               (OutputBuffer *)
               buf._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl,
               "#0.    0: V:0  | alloca 4\n#0.    8: V:4  | i32.const 0\n#0.   16: V:5  | local.set $5, 0\n#0.   24: V:4  | i64.const 1\n#0.   36: V:5  | local.set $4, 1\n#0.   44: V:4  | f32.const 2\n#0.   52: V:5  | local.set $3, 2\n#0.   60: V:4  | f64.const 3\n#0.   72: V:5  | local.set $2, 3\n#0.   80: V:4  | drop_keep $4 $0\n#0.   92: V:0  | return\n"
              );
    std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr(&buf)
    ;
  }
  wabt::MemoryStream::~MemoryStream(&stream);
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::reset(&func);
  return;
}

Assistant:

TEST_F(InterpTest, Local_Trace) {
  // (func (export "a")
  //   (local i32 i64 f32 f64)
  //   (local.set 0 (i32.const 0))
  //   (local.set 1 (i64.const 1))
  //   (local.set 2 (f32.const 2))
  //   (local.set 3 (f64.const 3)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01,
      0x61, 0x00, 0x00, 0x0a, 0x26, 0x01, 0x24, 0x04, 0x01, 0x7f, 0x01,
      0x7e, 0x01, 0x7d, 0x01, 0x7c, 0x41, 0x00, 0x21, 0x00, 0x42, 0x01,
      0x21, 0x01, 0x43, 0x00, 0x00, 0x00, 0x40, 0x21, 0x02, 0x44, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40, 0x21, 0x03, 0x0b,
  });

  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:0  | alloca 4
#0.    8: V:4  | i32.const 0
#0.   16: V:5  | local.set $5, 0
#0.   24: V:4  | i64.const 1
#0.   36: V:5  | local.set $4, 1
#0.   44: V:4  | f32.const 2
#0.   52: V:5  | local.set $3, 2
#0.   60: V:4  | f64.const 3
#0.   72: V:5  | local.set $2, 3
#0.   80: V:4  | drop_keep $4 $0
#0.   92: V:0  | return
)");
}